

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::BP32::decodeArray(BP32 *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t i;
  long lVar2;
  uint32_t *out_00;
  uint32_t *in_00;
  uint32_t Bs [4];
  uint local_48 [6];
  
  uVar1 = *in;
  in_00 = in + 1;
  out_00 = out;
  if ((ulong)uVar1 != 0) {
    do {
      local_48[0] = (uint)*(byte *)((long)in_00 + 3);
      local_48[1] = (uint)*(byte *)((long)in_00 + 2);
      local_48[2] = (uint)*(byte *)((long)in_00 + 1);
      local_48[3] = (uint)(byte)*in_00;
      in_00 = in_00 + 1;
      lVar2 = 0;
      do {
        fastunpack(in_00,out_00,local_48[lVar2]);
        in_00 = in_00 + local_48[lVar2];
        lVar2 = lVar2 + 1;
        out_00 = out_00 + 0x20;
      } while (lVar2 != 4);
    } while (out_00 < out + uVar1);
  }
  *nvalue = (long)out_00 - (long)out >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength;) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i, out += MiniBlockSize) {
        fastunpack(in, out, Bs[i]);
        in += Bs[i];
      }
    }
    nvalue = out - initout;
    return in;
  }